

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O0

void __thiscall
tf::Executor::_tear_down_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  long lVar1;
  uint uVar2;
  Worker *worker_00;
  BoundedTaskQueue<tf::Node_*,_8UL> *pBVar3;
  Executor *in_RCX;
  void *in_RDX;
  Executor *in_RDI;
  nstate_t state;
  Node *parent;
  Executor *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff80;
  
  worker_00 = *(Worker **)((long)in_RDX + 0x38);
  if (worker_00 == (Worker *)0x0) {
    _decrement_topology(in_stack_ffffffffffffff60);
  }
  else {
    uVar2 = *(uint *)worker_00;
    pBVar3 = &worker_00->_wsq;
    LOCK();
    lVar1 = (pBVar3->_top).super___atomic_base<long>._M_i;
    (pBVar3->_top).super___atomic_base<long>._M_i =
         (pBVar3->_top).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((lVar1 == 1) && ((uVar2 & 0x20000000) != 0)) {
      if ((in_RCX->_taskflows_mutex).super___mutex_base._M_mutex.__align != 0) {
        _schedule(in_RCX,worker_00,(Node *)CONCAT44(uVar2,in_stack_ffffffffffffff80));
      }
      (in_RCX->_taskflows_mutex).super___mutex_base._M_mutex.__align = (long)worker_00;
      in_stack_ffffffffffffff60 = in_RDI;
    }
  }
  if (in_RDX != (void *)0x0) {
    Node::~Node((Node *)in_stack_ffffffffffffff60);
    operator_delete(in_RDX,0xd8);
  }
  return;
}

Assistant:

inline void Executor::_tear_down_async(Worker& worker, Node* node, Node*& cache) {
  
  // from executor
  if(auto parent = node->_parent; parent == nullptr) {
    _decrement_topology();
  }
  // from runtime
  else {
    auto state = parent->_nstate;
    if(parent->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      if(state & NSTATE::PREEMPTED) {
        _update_cache(worker, cache, parent);
      }
    }
  }
  recycle(node);
}